

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xmlXPathRegisterFuncNS(xmlXPathContextPtr ctxt,xmlChar *name,xmlChar *ns_uri,xmlXPathFunction f)

{
  int iVar1;
  xmlHashTablePtr hash;
  
  if (name == (xmlChar *)0x0 || ctxt == (xmlXPathContextPtr)0x0) {
    return -1;
  }
  hash = ctxt->funcHash;
  if (hash == (xmlHashTablePtr)0x0) {
    hash = xmlHashCreate(0);
    ctxt->funcHash = hash;
    if (hash == (xmlHashTablePtr)0x0) goto LAB_001b0211;
  }
  if (f == (xmlXPathFunction)0x0) {
    iVar1 = xmlHashRemoveEntry2(hash,name,ns_uri,(xmlHashDeallocator)0x0);
    return iVar1;
  }
  iVar1 = xmlHashAddEntry2(hash,name,ns_uri,f);
  if (-1 < iVar1) {
    return 0;
  }
LAB_001b0211:
  xmlXPathErrMemory(ctxt);
  return -1;
}

Assistant:

int
xmlXPathRegisterFuncNS(xmlXPathContextPtr ctxt, const xmlChar *name,
		       const xmlChar *ns_uri, xmlXPathFunction f) {
    int ret;
    void *payload;

    if (ctxt == NULL)
	return(-1);
    if (name == NULL)
	return(-1);

    if (ctxt->funcHash == NULL)
	ctxt->funcHash = xmlHashCreate(0);
    if (ctxt->funcHash == NULL) {
        xmlXPathErrMemory(ctxt);
	return(-1);
    }
    if (f == NULL)
        return(xmlHashRemoveEntry2(ctxt->funcHash, name, ns_uri, NULL));
    memcpy(&payload, &f, sizeof(f));
    ret = xmlHashAddEntry2(ctxt->funcHash, name, ns_uri, payload);
    if (ret < 0) {
        xmlXPathErrMemory(ctxt);
        return(-1);
    }

    return(0);
}